

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateGeneric::IntStateScatterReactions
          (ChLinkMateGeneric *this,uint off_L,ChVectorDynamic<> *L)

{
  ChVector<double> *pCVar1;
  ChVector<double> *pCVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ChConstraintTwoBodies *pCVar7;
  CoeffReturnType pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  dVar3 = DAT_011dd3e0;
  pCVar1 = &(this->super_ChLinkMate).super_ChLink.react_force;
  if (pCVar1 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMate).super_ChLink.react_force.m_data[0] = VNULL;
    (this->super_ChLinkMate).super_ChLink.react_force.m_data[1] = dVar3;
    (this->super_ChLinkMate).super_ChLink.react_force.m_data[2] = DAT_011dd3e8;
  }
  dVar3 = DAT_011dd3e0;
  pCVar2 = &(this->super_ChLinkMate).super_ChLink.react_torque;
  if (pCVar2 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMate).super_ChLink.react_torque.m_data[0] = VNULL;
    (this->super_ChLinkMate).super_ChLink.react_torque.m_data[1] = dVar3;
    (this->super_ChLinkMate).super_ChLink.react_torque.m_data[2] = DAT_011dd3e8;
  }
  iVar6 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])(this);
  if ((char)iVar6 != '\0') {
    iVar6 = 0;
    if (this->c_x == true) {
      pCVar7 = ChLinkMask::Constr_N(&this->mask,0);
      iVar6 = 1;
      if ((pCVar7->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                            (ulong)off_L);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *pdVar8;
        auVar9._8_8_ = 0x8000000000000000;
        auVar9._0_8_ = 0x8000000000000000;
        auVar9 = vxorpd_avx512vl(auVar10,auVar9);
        dVar3 = (double)vmovlpd_avx(auVar9);
        pCVar1->m_data[0] = dVar3;
      }
    }
    if (this->c_y == true) {
      pCVar7 = ChLinkMask::Constr_N(&this->mask,iVar6);
      if ((pCVar7->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                            (ulong)(iVar6 + off_L));
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *pdVar8;
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar9 = vxorpd_avx512vl(auVar11,auVar4);
        dVar3 = (double)vmovlpd_avx(auVar9);
        (this->super_ChLinkMate).super_ChLink.react_force.m_data[1] = dVar3;
      }
      iVar6 = iVar6 + 1;
    }
    if (this->c_z == true) {
      pCVar7 = ChLinkMask::Constr_N(&this->mask,iVar6);
      if ((pCVar7->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                            (ulong)(iVar6 + off_L));
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *pdVar8;
        auVar5._8_8_ = 0x8000000000000000;
        auVar5._0_8_ = 0x8000000000000000;
        auVar9 = vxorpd_avx512vl(auVar12,auVar5);
        dVar3 = (double)vmovlpd_avx(auVar9);
        (this->super_ChLinkMate).super_ChLink.react_force.m_data[2] = dVar3;
      }
      iVar6 = iVar6 + 1;
    }
    if (this->c_rx == true) {
      pCVar7 = ChLinkMask::Constr_N(&this->mask,iVar6);
      if ((pCVar7->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                            (ulong)(iVar6 + off_L));
        pCVar2->m_data[0] = *pdVar8 * -0.5;
      }
      iVar6 = iVar6 + 1;
    }
    if (this->c_ry == true) {
      pCVar7 = ChLinkMask::Constr_N(&this->mask,iVar6);
      if ((pCVar7->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                            (ulong)(iVar6 + off_L));
        (this->super_ChLinkMate).super_ChLink.react_torque.m_data[1] = *pdVar8 * -0.5;
      }
      iVar6 = iVar6 + 1;
    }
    if (this->c_rz == true) {
      pCVar7 = ChLinkMask::Constr_N(&this->mask,iVar6);
      if ((pCVar7->super_ChConstraintTwo).super_ChConstraint.active == true) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                            (ulong)(iVar6 + off_L));
        (this->super_ChLinkMate).super_ChLink.react_torque.m_data[2] = *pdVar8 * -0.5;
      }
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    react_force = VNULL;
    react_torque = VNULL;

    if (!this->IsActive())
        return;

    int nc = 0;
    if (c_x) {
        if (mask.Constr_N(nc).IsActive())
            react_force.x() = -L(off_L + nc);
        nc++;
    }
    if (c_y) {
        if (mask.Constr_N(nc).IsActive())
            react_force.y() = -L(off_L + nc);
        nc++;
    }
    if (c_z) {
        if (mask.Constr_N(nc).IsActive())
            react_force.z() = -L(off_L + nc);
        nc++;
    }
    if (c_rx) {
        if (mask.Constr_N(nc).IsActive())
            react_torque.x() = -0.5 * L(off_L + nc);
        nc++;
    }
    if (c_ry) {
        if (mask.Constr_N(nc).IsActive())
            react_torque.y() = -0.5 * L(off_L + nc);
        nc++;
    }
    if (c_rz) {
        if (mask.Constr_N(nc).IsActive())
            react_torque.z() = -0.5 * L(off_L + nc);
        nc++;
    }
}